

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O3

bool __thiscall bloaty::dwarf::LocationList::NextEntry(LocationList *this)

{
  string_view *data;
  uint64_t uVar1;
  uint64_t uVar2;
  ulong uVar3;
  ushort *puVar4;
  ulong uVar5;
  
  data = &this->remaining_;
  uVar1 = CompilationUnitSizes::ReadAddress(&this->sizes_,data);
  uVar2 = CompilationUnitSizes::ReadAddress(&this->sizes_,data);
  if (((uVar2 != 0 || uVar1 != 0) && (uVar1 != 0xffffffffffffffff)) &&
     ((uVar1 != 0xffffffff || ((this->sizes_).addr8_ == true)))) {
    if (data->_M_len < 2) {
      Throw("premature EOF reading fixed-length data",0x8d);
    }
    puVar4 = (ushort *)(this->remaining_)._M_str;
    uVar5 = (ulong)*puVar4;
    puVar4 = puVar4 + 1;
    (this->remaining_)._M_str = (char *)puVar4;
    uVar3 = data->_M_len - 2;
    (this->remaining_)._M_len = uVar3;
    if (uVar3 < uVar5) {
      Throw("premature EOF reading variable-length DWARF data",0xad);
    }
    (this->remaining_)._M_str = (char *)((long)puVar4 + uVar5);
    (this->remaining_)._M_len = uVar3 - uVar5;
  }
  return uVar2 != 0 || uVar1 != 0;
}

Assistant:

bool LocationList::NextEntry() {
  uint64_t start, end;
  start = sizes_.ReadAddress(&remaining_);
  end = sizes_.ReadAddress(&remaining_);
  if (start == 0 && end == 0) {
    return false;
  } else if (start == UINT64_MAX ||
             (start == UINT32_MAX && sizes_.address_size() == 4)) {
    // Base address selection, nothing more to do.
  } else {
    // Need to skip the location description.
    uint16_t length = ReadFixed<uint16_t>(&remaining_);
    SkipBytes(length, &remaining_);
  }
  return true;
}